

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.hpp
# Opt level: O2

void __thiscall ws::Server::Server(Server *this)

{
  this->inited = false;
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  (this->host)._M_string_length = 0;
  (this->host).field_2._M_local_buf[0] = '\0';
  this->port = -1;
  Crypto::Crypto(&this->crypto);
  Cli::Cli(&this->wxcli);
  httplib::Server::Server(&this->svr);
  *(undefined8 *)&(this->new_task_queue).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->new_task_queue).super__Function_base._M_functor + 8) = 0;
  (this->msg_handle).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->msg_handle)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->msg_handle).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->msg_handle).super__Function_base._M_functor + 8) = 0;
  (this->new_task_queue)._M_invoker =
       std::
       _Function_handler<httplib::TaskQueue_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/include/wxserver/server.hpp:93:31)>
       ::_M_invoke;
  (this->new_task_queue).super__Function_base._M_manager =
       std::
       _Function_handler<httplib::TaskQueue_*(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/include/wxserver/server.hpp:93:31)>
       ::_M_manager;
  return;
}

Assistant:

Server() : inited(false), port(-1),
               new_task_queue([] { return new httplib::ThreadPool(4); }) {}